

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  CURLcode CVar5;
  CURLUcode CVar6;
  Curl_handler *pCVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  size_t len;
  char *pcVar13;
  uint uVar14;
  char *scheme;
  char *pcVar15;
  byte bVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  bool bVar26;
  bool bVar27;
  dynbuf enc;
  char portbuf [7];
  size_t dlen;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char **)0x0) {
    return CURLUE_BAD_PARTPOINTER;
  }
  uVar14 = flags >> 6 & 3;
  *part = (char *)0x0;
  CVar6 = CURLUE_UNKNOWN_PART;
  switch(what) {
  case CURLUPART_URL:
    pcVar9 = u->options;
    pcVar12 = u->port;
    if ((u->scheme == (char *)0x0) || (iVar4 = Curl_strcasecompare("file",u->scheme), iVar4 == 0)) {
      if (u->host == (char *)0x0) {
        return CURLUE_NO_HOST;
      }
      scheme = u->scheme;
      if (scheme == (char *)0x0) {
        if ((flags & 4) != 0) {
          scheme = "https";
          goto LAB_005ba0ad;
        }
        CVar6 = CURLUE_NO_SCHEME;
LAB_005ba318:
        bVar26 = false;
      }
      else {
LAB_005ba0ad:
        pCVar7 = Curl_builtin_scheme(scheme,0xffffffffffffffff);
        if ((flags & 1) == 0 || pcVar12 != (char *)0x0) {
          if (pCVar7 != (Curl_handler *)0x0 && pcVar12 != (char *)0x0) {
            pcVar10 = (char *)0x0;
            if (u->portnum != (long)pCVar7->defport) {
              pcVar10 = pcVar12;
            }
            if ((flags & 2) != 0) {
              pcVar12 = pcVar10;
            }
          }
        }
        else if (pCVar7 == (Curl_handler *)0x0) {
          pcVar12 = (char *)0x0;
        }
        else {
          curl_msnprintf(portbuf,7,"%u",(ulong)(uint)pCVar7->defport);
          pcVar12 = portbuf;
        }
        if ((pCVar7 != (Curl_handler *)0x0) && ((pCVar7->flags & 0x400) == 0)) {
          pcVar9 = (char *)0x0;
        }
        pcVar10 = u->host;
        if (*pcVar10 == '[') {
          if (u->zoneid != (char *)0x0) {
            sVar8 = strlen(pcVar10);
            Curl_dyn_init(&enc,8000000);
            CVar5 = Curl_dyn_addf(&enc,"%.*s%%25%s]",(ulong)((int)sVar8 - 1),u->host,u->zoneid);
            if (CVar5 == CURLE_OK) {
              pcVar10 = Curl_dyn_ptr(&enc);
              goto LAB_005ba272;
            }
LAB_005ba312:
            CVar6 = CURLUE_OUT_OF_MEMORY;
            goto LAB_005ba318;
          }
LAB_005ba1c1:
          pcVar10 = (char *)0x0;
        }
        else {
          if (-1 < (char)flags) {
            for (; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
              if (*pcVar10 == '%') {
                Curl_dyn_init(&enc,8000000);
                pcVar10 = u->host;
                cVar3 = *pcVar10;
                bVar26 = cVar3 == '\0';
                if (bVar26) goto LAB_005ba244;
                goto LAB_005ba20d;
              }
            }
            goto LAB_005ba1c1;
          }
          pcVar10 = curl_easy_escape((Curl_easy *)0x0,pcVar10,0);
          if (pcVar10 == (char *)0x0) goto LAB_005ba312;
        }
LAB_005ba272:
        pcVar19 = u->password;
        bVar26 = pcVar19 == (char *)0x0;
        pcVar1 = "    :";
        pcVar2 = "    :";
        if (bVar26) {
          pcVar2 = "PK\x01\x02";
          pcVar19 = "";
        }
        bVar27 = pcVar9 == (char *)0x0;
        pcVar20 = ";";
        if (bVar27) {
          pcVar20 = "";
          pcVar9 = "";
        }
        pcVar21 = "@";
        if (bVar27) {
          pcVar21 = "";
        }
        if (!bVar26) {
          pcVar21 = "@";
        }
        pcVar13 = u->user;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar21 = "@";
        }
        pcVar18 = pcVar10;
        if (pcVar10 == (char *)0x0) {
          pcVar18 = u->host;
        }
        if (pcVar12 == (char *)0x0) {
          pcVar1 = "PK\x01\x02";
          pcVar12 = "";
        }
        pcVar17 = u->path;
        if (pcVar17 == (char *)0x0) {
          pcVar17 = "/";
          pcVar15 = "";
        }
        else {
          pcVar15 = "/";
          if (*pcVar17 == '/') {
            pcVar15 = "";
          }
        }
        pcVar24 = u->query;
        pcVar22 = "";
        if ((pcVar24 != (char *)0x0) && (pcVar22 = "?", *pcVar24 == '\0')) {
          pcVar22 = "";
        }
        pcVar23 = "";
        if ((pcVar24 != (char *)0x0) && (pcVar23 = "", *pcVar24 != '\0')) {
          pcVar23 = pcVar24;
        }
        pcVar24 = u->fragment;
        pcVar25 = "#";
        if (pcVar24 == (char *)0x0) {
          pcVar25 = "";
          pcVar24 = "";
        }
        u = (CURLU *)curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",scheme,pcVar13,pcVar2 + 4,
                                   pcVar19,pcVar20,pcVar9,pcVar21,pcVar18,pcVar1 + 4,pcVar12,pcVar15
                                   ,pcVar17,pcVar22,pcVar23,pcVar25,pcVar24);
        (*Curl_cfree)(pcVar10);
        CVar6 = CURLUE_OUT_OF_MEMORY;
        bVar26 = true;
      }
      if (!bVar26) {
        return CVar6;
      }
    }
    else {
      pcVar9 = u->fragment;
      pcVar12 = "#";
      if (pcVar9 == (char *)0x0) {
        pcVar12 = "";
        pcVar9 = "";
      }
      u = (CURLU *)curl_maprintf("file://%s%s%s",u->path,pcVar12,pcVar9);
    }
    if (u == (CURLU *)0x0) goto LAB_005ba3ed;
    *part = (char *)u;
    goto LAB_005ba3e8;
  case CURLUPART_SCHEME:
    pcVar9 = u->scheme;
    CVar6 = CURLUE_NO_SCHEME;
    goto LAB_005b9e58;
  case CURLUPART_USER:
    pcVar9 = u->user;
    CVar6 = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    pcVar9 = u->password;
    CVar6 = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    pcVar9 = u->options;
    CVar6 = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    pcVar9 = u->host;
    CVar6 = CURLUE_NO_HOST;
    break;
  case CURLUPART_PORT:
    pcVar9 = u->port;
    if (((flags & 1) == 0 || pcVar9 != (char *)0x0) || (u->scheme == (char *)0x0)) {
      CVar6 = CURLUE_NO_PORT;
      if (pcVar9 == (char *)0x0) goto LAB_005ba08f;
      if ((u->scheme != (char *)0x0) &&
         (pCVar7 = Curl_builtin_scheme(u->scheme,0xffffffffffffffff), pCVar7 != (Curl_handler *)0x0)
         ) {
        pcVar12 = (char *)0x0;
        if (u->portnum != (long)pCVar7->defport) {
          pcVar12 = pcVar9;
        }
        if ((flags & 2) != 0) {
          pcVar9 = pcVar12;
        }
      }
    }
    else {
      pCVar7 = Curl_builtin_scheme(u->scheme,0xffffffffffffffff);
      CVar6 = CURLUE_NO_PORT;
      if (pCVar7 == (Curl_handler *)0x0) {
LAB_005ba08f:
        CVar6 = CURLUE_NO_PORT;
        uVar14 = 0;
        goto switchD_005b9d68_default;
      }
      curl_msnprintf(portbuf,7,"%u",(ulong)(uint)pCVar7->defport);
      pcVar9 = portbuf;
    }
LAB_005b9e58:
    bVar16 = 0;
    uVar14 = 0;
    goto LAB_005b9ed9;
  case CURLUPART_PATH:
    pcVar9 = u->path;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (*Curl_cstrdup)("/");
      u->path = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_005ba3ed;
    }
    break;
  case CURLUPART_QUERY:
    pcVar9 = u->query;
    CVar6 = CURLUE_NO_QUERY;
    bVar16 = (byte)uVar14;
    goto LAB_005b9ed9;
  case CURLUPART_FRAGMENT:
    pcVar9 = u->fragment;
    CVar6 = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_ZONEID:
    pcVar9 = u->zoneid;
    CVar6 = CURLUE_NO_ZONEID;
    break;
  default:
switchD_005b9d68_default:
    bVar16 = 0;
    pcVar9 = (char *)0x0;
    goto LAB_005b9ed9;
  }
  bVar16 = 0;
LAB_005b9ed9:
  if (pcVar9 != (char *)0x0) {
    sVar8 = strlen(pcVar9);
    pcVar9 = (char *)Curl_memdup(pcVar9,sVar8 + 1);
    *part = pcVar9;
    if (pcVar9 == (char *)0x0) {
LAB_005ba3ed:
      CVar6 = CURLUE_OUT_OF_MEMORY;
    }
    else {
      if ((~bVar16 & 1) == 0 && sVar8 != 0) {
        sVar11 = 0;
        do {
          if (pcVar9[sVar11] == '+') {
            pcVar9[sVar11] = ' ';
          }
          sVar11 = sVar11 + 1;
        } while (sVar8 != sVar11);
      }
      if ((uVar14 & 1) != 0) {
        CVar5 = Curl_urldecode(*part,0,&enc.bufr,&dlen,REJECT_CTRL);
        (*Curl_cfree)(*part);
        if (CVar5 != CURLE_OK) {
          *part = (char *)0x0;
          return CURLUE_URLDECODE;
        }
        *part = enc.bufr;
        sVar8 = dlen;
      }
      if ((char)flags < '\0') {
        Curl_dyn_init(&enc,8000000);
        CVar6 = urlencode_str(&enc,*part,sVar8,true,what == CURLUPART_QUERY);
        if (CVar6 != CURLUE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)(*part);
        pcVar9 = Curl_dyn_ptr(&enc);
        *part = pcVar9;
      }
LAB_005ba3e8:
      CVar6 = CURLUE_OK;
    }
  }
  return CVar6;
  while( true ) {
    cVar3 = pcVar10[1];
    pcVar10 = pcVar10 + 1;
    bVar26 = cVar3 == '\0';
    if (bVar26) break;
LAB_005ba20d:
    if (cVar3 == '%') {
      len = 3;
      pcVar19 = "%25";
    }
    else {
      len = 1;
      pcVar19 = pcVar10;
    }
    CVar5 = Curl_dyn_addn(&enc,pcVar19,len);
    if (CVar5 != CURLE_OK) goto LAB_005ba25f;
  }
LAB_005ba244:
  (*Curl_cfree)(u->host);
  pcVar10 = Curl_dyn_ptr(&enc);
  u->host = pcVar10;
LAB_005ba25f:
  if (!bVar26) goto LAB_005ba312;
  pcVar10 = (char *)0x0;
  goto LAB_005ba272;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool urlencode = (flags & CURLU_URLENCODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_ZONEID:
    ptr = u->zoneid;
    ifmissing = CURLUE_NO_ZONEID;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%u", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    char *allochost = NULL;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      h = Curl_builtin_scheme(scheme, CURL_ZERO_TERMINATED);
      if(!port && (flags & CURLU_DEFAULT_PORT)) {
        /* there's no stored port number, but asked to deliver
           a default one for the scheme */
        if(h) {
          msnprintf(portbuf, sizeof(portbuf), "%u", h->defport);
          port = portbuf;
        }
      }
      else if(port) {
        /* there is a stored port number, but asked to inhibit if it matches
           the default one for the scheme */
        if(h && (h->defport == u->portnum) &&
           (flags & CURLU_NO_DEFAULT_PORT))
          port = NULL;
      }

      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      if(u->host[0] == '[') {
        if(u->zoneid) {
          /* make it '[ host %25 zoneid ]' */
          struct dynbuf enc;
          size_t hostlen = strlen(u->host);
          Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
          if(Curl_dyn_addf(&enc, "%.*s%%25%s]", (int)hostlen - 1, u->host,
                           u->zoneid))
            return CURLUE_OUT_OF_MEMORY;
          allochost = Curl_dyn_ptr(&enc);
        }
      }
      else if(urlencode) {
        allochost = curl_easy_escape(NULL, u->host, 0);
        if(!allochost)
          return CURLUE_OUT_OF_MEMORY;
      }
      else {
        /* only encode '%' in output host name */
        char *host = u->host;
        bool percent = FALSE;
        /* first, count number of percents present in the name */
        while(*host) {
          if(*host == '%') {
            percent = TRUE;
            break;
          }
          host++;
        }
        /* if there were percent(s), encode the host name */
        if(percent) {
          struct dynbuf enc;
          CURLcode result;
          Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
          host = u->host;
          while(*host) {
            if(*host == '%')
              result = Curl_dyn_addn(&enc, "%25", 3);
            else
              result = Curl_dyn_addn(&enc, host, 1);
            if(result)
              return CURLUE_OUT_OF_MEMORY;
            host++;
          }
          free(u->host);
          u->host = Curl_dyn_ptr(&enc);
        }
      }

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    allochost ? allochost : u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
      free(allochost);
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
  }
  default:
    ptr = NULL;
    break;
  }
  if(ptr) {
    size_t partlen = strlen(ptr);
    size_t i = 0;
    *part = Curl_memdup(ptr, partlen + 1);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus = *part;
      for(i = 0; i < partlen; ++plus, i++) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      /* this unconditional rejection of control bytes is documented
         API behavior */
      CURLcode res = Curl_urldecode(*part, 0, &decoded, &dlen, REJECT_CTRL);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
      partlen = dlen;
    }
    if(urlencode) {
      struct dynbuf enc;
      Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
      if(urlencode_str(&enc, *part, partlen, TRUE,
                       what == CURLUPART_QUERY))
        return CURLUE_OUT_OF_MEMORY;
      free(*part);
      *part = Curl_dyn_ptr(&enc);
    }

    return CURLUE_OK;
  }
  else
    return ifmissing;
}